

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmctest.cpp
# Opt level: O0

double * getPartials(char *sequence,int repeats)

{
  size_t sVar1;
  double *pdVar2;
  char *in_RDI;
  int i;
  int k;
  double *partials;
  int n;
  int local_20;
  int local_1c;
  
  sVar1 = strlen(in_RDI);
  pdVar2 = (double *)malloc((long)(int)sVar1 << 5);
  local_1c = 0;
  for (local_20 = 0; local_20 < (int)sVar1; local_20 = local_20 + 1) {
    switch(in_RDI[local_20]) {
    case 'A':
      pdVar2[local_1c] = 1.0;
      pdVar2[local_1c + 1] = 0.0;
      pdVar2[local_1c + 2] = 0.0;
      pdVar2[local_1c + 3] = 0.0;
      break;
    default:
      pdVar2[local_1c] = 1.0;
      pdVar2[local_1c + 1] = 1.0;
      pdVar2[local_1c + 2] = 1.0;
      pdVar2[local_1c + 3] = 1.0;
      break;
    case 'C':
      pdVar2[local_1c] = 0.0;
      pdVar2[local_1c + 1] = 1.0;
      pdVar2[local_1c + 2] = 0.0;
      pdVar2[local_1c + 3] = 0.0;
      break;
    case 'G':
      pdVar2[local_1c] = 0.0;
      pdVar2[local_1c + 1] = 0.0;
      pdVar2[local_1c + 2] = 1.0;
      pdVar2[local_1c + 3] = 0.0;
      break;
    case 'T':
      pdVar2[local_1c] = 0.0;
      pdVar2[local_1c + 1] = 0.0;
      pdVar2[local_1c + 2] = 0.0;
      pdVar2[local_1c + 3] = 1.0;
    }
    local_1c = local_1c + 4;
  }
  return pdVar2;
}

Assistant:

double* getPartials(char *sequence, int repeats) {
	int n = strlen(sequence);
	double *partials = (double*)malloc(sizeof(double) * n * 4);

    int k = 0;
	for (int i = 0; i < n; i++) {
		switch (sequence[i]) {
			case 'A':
				partials[k++] = 1;
				partials[k++] = 0;
				partials[k++] = 0;
				partials[k++] = 0;
				break;
			case 'C':
				partials[k++] = 0;
				partials[k++] = 1;
				partials[k++] = 0;
				partials[k++] = 0;
				break;
			case 'G':
				partials[k++] = 0;
				partials[k++] = 0;
				partials[k++] = 1;
				partials[k++] = 0;
				break;
			case 'T':
				partials[k++] = 0;
				partials[k++] = 0;
				partials[k++] = 0;
				partials[k++] = 1;
				break;
			default:
				partials[k++] = 1;
				partials[k++] = 1;
				partials[k++] = 1;
				partials[k++] = 1;
				break;
		}
	}
	return partials;
}